

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void test_cpp_wrapper_range
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int min_key,int max_key)

{
  long lVar1;
  int *expected_records;
  int key;
  uint expected_num_records;
  int max_key_00;
  int min_key_00;
  Dictionary<int,_int> *dict_00;
  Dictionary<int,_int> *tc_00;
  ion_boolean_t *piVar2;
  undefined8 uStack_60;
  ion_boolean_t aiStack_58 [8];
  undefined8 uStack_50;
  int *local_48;
  int local_3c;
  ulong uStack_38;
  int i;
  unsigned_long __vla_expr0;
  int local_28;
  uint local_24;
  int curr_pos;
  int records_expected;
  int max_key_local;
  int min_key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  dict_local = (Dictionary<int,_int> *)tc;
  _max_key_local = dict;
  records_expected = min_key;
  curr_pos = max_key;
  local_24 = (max_key - min_key) + 1;
  local_28 = 0;
  __vla_expr0 = (unsigned_long)&local_48;
  lVar1 = -((ulong)local_24 * 4 + 0xf & 0xfffffffffffffff0);
  local_48 = (int *)((long)&local_48 + lVar1);
  uStack_38 = (ulong)local_24;
  for (local_3c = 0; tc_00 = dict_local, dict_00 = _max_key_local, min_key_00 = records_expected,
      max_key_00 = curr_pos, expected_num_records = local_24, key = local_3c,
      expected_records = local_48, local_3c < curr_pos + 5; local_3c = local_3c + 1) {
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10d00e;
    cpp_wrapper_insert((planck_unit_test_t *)tc_00,dict_00,key,key,'\x01');
    if ((records_expected <= local_3c) && (local_3c <= curr_pos)) {
      local_48[local_28] = local_3c;
      local_28 = local_28 + 1;
    }
  }
  piVar2 = aiStack_58 + lVar1;
  piVar2[0] = '\x01';
  piVar2[1] = '\0';
  piVar2[2] = '\0';
  piVar2[3] = '\0';
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10d068;
  cpp_wrapper_range((planck_unit_test_t *)tc_00,dict_00,min_key_00,max_key_00,expected_records,
                    expected_num_records,aiStack_58[lVar1]);
  return;
}

Assistant:

void
test_cpp_wrapper_range(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int min_key,
	int max_key
) {
	/* records_expected is calculated the following way because it is min_key and max_key inclusive. */
	int records_expected	= max_key - min_key + 1;
	int curr_pos			= 0;
	int nums[records_expected];

	for (int i = 0; i < max_key + 5; i++) {
		cpp_wrapper_insert(tc, dict, i, i, boolean_true);

		if ((i >= min_key) && (i <= max_key)) {
			nums[curr_pos] = i;
			curr_pos++;
		}
	}

	cpp_wrapper_range(tc, dict, min_key, max_key, nums, records_expected, boolean_true);
}